

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::doWalkFunction(OptimizeInstructions *this,Function *func)

{
  PassOptions *pPVar1;
  Module *pMVar2;
  undefined1 local_330 [8];
  FinalOptimizer optimizer;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_220;
  undefined1 local_100 [8];
  LocalScanner scanner;
  Function *func_local;
  OptimizeInstructions *this_local;
  
  scanner.passOptions = (PassOptions *)func;
  pPVar1 = Pass::getPassOptions((Pass *)this);
  this->fastMath = (bool)(pPVar1->fastMath & 1);
  pPVar1 = Pass::getPassOptions((Pass *)this);
  LocalScanner::LocalScanner((LocalScanner *)local_100,&this->localInfo,pPVar1);
  pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::setModule
            ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)local_100,
             pMVar2);
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::walkFunction
            ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)local_100,
             (Function *)scanner.passOptions);
  LocalScanner::~LocalScanner((LocalScanner *)local_100);
  Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
  doWalkFunction(&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 ,(Function *)scanner.passOptions);
  if ((this->refinalize & 1U) != 0) {
    ReFinalize::ReFinalize((ReFinalize *)&optimizer.passOptions);
    pPVar1 = scanner.passOptions;
    pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_220,(Function *)pPVar1,pMVar2);
    ReFinalize::~ReFinalize((ReFinalize *)&optimizer.passOptions);
  }
  pPVar1 = Pass::getPassOptions((Pass *)this);
  anon_unknown_278::FinalOptimizer::FinalOptimizer((FinalOptimizer *)local_330,pPVar1);
  Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
  ::walkFunction((Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
                  *)local_330,(Function *)scanner.passOptions);
  anon_unknown_278::FinalOptimizer::~FinalOptimizer((FinalOptimizer *)local_330);
  pPVar1 = scanner.passOptions;
  pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
           getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    );
  EHUtils::handleBlockNestedPops((Function *)pPVar1,pMVar2);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    fastMath = getPassOptions().fastMath;

    // First, scan locals.
    {
      LocalScanner scanner(localInfo, getPassOptions());
      scanner.setModule(getModule());
      scanner.walkFunction(func);
    }

    // Main walk.
    super::doWalkFunction(func);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, getModule());
    }

    // Final optimizations.
    {
      FinalOptimizer optimizer(getPassOptions());
      optimizer.walkFunction(func);
    }

    // Some patterns create blocks that can interfere 'catch' and 'pop', nesting
    // the 'pop' into a block making it invalid.
    EHUtils::handleBlockNestedPops(func, *getModule());
  }